

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O0

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)

{
  undefined4 in_EDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ARKodeButcherTable B_26;
  ARKodeButcherTable B_25;
  ARKodeButcherTable B_24;
  ARKodeButcherTable B_23;
  ARKodeButcherTable B_22;
  ARKodeButcherTable B_21;
  ARKodeButcherTable B_20;
  ARKodeButcherTable B_19;
  ARKodeButcherTable B_18;
  ARKodeButcherTable B_17;
  ARKodeButcherTable B_16;
  ARKodeButcherTable B_15;
  ARKodeButcherTable B_14;
  ARKodeButcherTable B_13;
  ARKodeButcherTable B_12;
  ARKodeButcherTable B_11;
  ARKodeButcherTable B_10;
  ARKodeButcherTable B_9;
  ARKodeButcherTable B_8;
  ARKodeButcherTable B_7;
  ARKodeButcherTable B_6;
  ARKodeButcherTable B_5;
  ARKodeButcherTable B_4;
  ARKodeButcherTable B_3;
  sunrealtype beta;
  sunrealtype twogamma;
  sunrealtype delta;
  sunrealtype gamma;
  ARKodeButcherTable B_2;
  ARKodeButcherTable B_1;
  ARKodeButcherTable B;
  int embedded;
  undefined8 in_stack_fffffffffffffed8;
  int stages;
  ARKodeButcherTable local_8;
  
  embedded = (int)in_stack_fffffffffffffed8;
  stages = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  switch(in_EDI) {
  default:
    arkProcessError((ARKodeMem)0x0,-0x16,0x29,"ARKodeButcherTable_LoadDIRK",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_butcher_dirk.c"
                    ,"Unknown Butcher table");
    local_8 = (ARKodeButcherTable)0x0;
    break;
  case 100:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 2;
    local_8->p = 1;
    **local_8->A = 1.0;
    *local_8->A[1] = -1.0;
    local_8->A[1][1] = 1.0;
    *local_8->b = 0.5;
    local_8->b[1] = 0.5;
    *local_8->d = 1.0;
    *local_8->c = 1.0;
    local_8->c[1] = 0.0;
    break;
  case 0x65:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 2;
    local_8->p = 3;
    **local_8->A = 0.2928932188134525;
    *local_8->A[1] = 0.7989898732233307;
    local_8->A[1][1] = 0.2928932188134525;
    *local_8->A[2] = 0.7407892288408794;
    local_8->A[2][1] = 0.25921077115912056;
    local_8->A[2][2] = 0.2928932188134525;
    *local_8->d = 0.6916651159922363;
    local_8->d[1] = 0.5035970298833986;
    local_8->d[2] = -0.19526214587563498;
    *local_8->b = 0.7407892288408794;
    local_8->b[1] = 0.25921077115912056;
    *local_8->c = 0.2928932188134525;
    local_8->c[1] = 1.0918830920367832;
    local_8->c[2] = 1.2928932188134525;
    break;
  case 0x66:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 2;
    local_8->p = 3;
    dVar1 = sqrt(2.0);
    *local_8->A[1] = (2.0 - dVar1) / 2.0;
    dVar1 = sqrt(2.0);
    local_8->A[1][1] = (2.0 - dVar1) / 2.0;
    dVar1 = sqrt(2.0);
    *local_8->A[2] = dVar1 / 4.0;
    dVar1 = sqrt(2.0);
    local_8->A[2][1] = dVar1 / 4.0;
    dVar1 = sqrt(2.0);
    local_8->A[2][2] = (2.0 - dVar1) / 2.0;
    dVar1 = sqrt(2.0);
    *local_8->d = (1.0 - dVar1 / 4.0) / 3.0;
    dVar1 = sqrt(2.0);
    local_8->d[1] = ((dVar1 * 3.0) / 4.0 + 1.0) / 3.0;
    dVar1 = sqrt(2.0);
    local_8->d[2] = (2.0 - dVar1) / 6.0;
    dVar1 = sqrt(2.0);
    *local_8->b = dVar1 / 4.0;
    dVar1 = sqrt(2.0);
    local_8->b[1] = dVar1 / 4.0;
    dVar1 = sqrt(2.0);
    local_8->b[2] = (2.0 - dVar1) / 2.0;
    dVar1 = sqrt(2.0);
    local_8->c[1] = 2.0 - dVar1;
    local_8->c[2] = 1.0;
    break;
  case 0x67:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 3;
    local_8->p = 2;
    *local_8->A[1] = 0.435866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 0.49056338842178054;
    local_8->A[2][1] = 0.07357009006976042;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.30880996997674653;
    local_8->A[3][1] = 1.4905633884217806;
    local_8->A[3][2] = -1.2352398799069861;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->b = 0.30880996997674653;
    local_8->b[1] = 1.4905633884217806;
    local_8->b[2] = -1.2352398799069861;
    local_8->b[3] = 0.435866521508459;
    *local_8->d = 0.49056338842178054;
    local_8->d[1] = 0.07357009006976042;
    local_8->d[2] = 0.435866521508459;
    local_8->c[1] = 0.871733043016918;
    local_8->c[2] = 1.0;
    local_8->c[3] = 1.0;
    break;
  case 0x68:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 3;
    local_8->p = 2;
    *local_8->A[1] = 0.435866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 0.2576482460664272;
    local_8->A[2][1] = -0.09351476757488625;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.18764102434672383;
    local_8->A[3][1] = -0.595297473576955;
    local_8->A[3][2] = 0.9717899277217721;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->b = 0.18764102434672383;
    local_8->b[1] = -0.595297473576955;
    local_8->b[2] = 0.9717899277217721;
    local_8->b[3] = 0.435866521508459;
    *local_8->d = 0.21474028622338914;
    local_8->d[1] = -0.4851622638849391;
    local_8->d[2] = 0.8687250025203875;
    local_8->d[3] = 0.4016969751411624;
    local_8->c[1] = 0.871733043016918;
    local_8->c[2] = 0.6;
    local_8->c[3] = 1.0;
    break;
  case 0x69:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 2;
    **local_8->A = 0.435866521508459;
    *local_8->A[1] = -1.135866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 1.0854333065011879;
    local_8->A[2][1] = -0.7212998280096468;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.41634950157878;
    local_8->A[3][1] = 0.19098400417955613;
    local_8->A[3][2] = -0.11864326546011505;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->A[4] = 0.8968696529704295;
    local_8->A[4][1] = 0.018272527273968903;
    local_8->A[4][2] = -0.08459003110197204;
    local_8->A[4][3] = -0.2664186706508854;
    local_8->A[4][4] = 0.435866521508459;
    *local_8->b = 0.8968696529704295;
    local_8->b[1] = 0.018272527273968903;
    local_8->b[2] = -0.08459003110197204;
    local_8->b[3] = -0.2664186706508854;
    local_8->b[4] = 0.435866521508459;
    *local_8->d = 1.0564621610700966;
    local_8->d[1] = -0.05646216107009664;
    *local_8->c = 0.435866521508459;
    local_8->c[1] = -0.7;
    local_8->c[2] = 0.8;
    local_8->c[3] = 0.92455676180668;
    local_8->c[4] = 1.0;
    break;
  case 0x6a:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    **local_8->A = 0.435866521508459;
    *local_8->A[1] = -1.135866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 1.0854333065011879;
    local_8->A[2][1] = -0.7212998280096468;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.41634950157878;
    local_8->A[3][1] = 0.19098400417955613;
    local_8->A[3][2] = -0.11864326546011505;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->A[4] = 0.8968696529704295;
    local_8->A[4][1] = 0.018272527273968903;
    local_8->A[4][2] = -0.08459003110197204;
    local_8->A[4][3] = -0.2664186706508854;
    local_8->A[4][4] = 0.435866521508459;
    *local_8->b = 0.8968696529704295;
    local_8->b[1] = 0.018272527273968903;
    local_8->b[2] = -0.08459003110197204;
    local_8->b[3] = -0.2664186706508854;
    local_8->b[4] = 0.435866521508459;
    *local_8->d = 0.7766919329157524;
    local_8->d[1] = 0.02974727915032039;
    local_8->d[2] = -0.026744023915640965;
    local_8->d[3] = 0.22030481184956816;
    *local_8->c = 0.435866521508459;
    local_8->c[1] = -0.7;
    local_8->c[2] = 0.8;
    local_8->c[3] = 0.92455676180668;
    local_8->c[4] = 1.0;
    break;
  case 0x6b:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    **local_8->A = 0.25;
    *local_8->A[1] = 0.5;
    local_8->A[1][1] = 0.25;
    *local_8->A[2] = 0.34;
    local_8->A[2][1] = -0.04;
    local_8->A[2][2] = 0.25;
    *local_8->A[3] = 0.2727941176470588;
    local_8->A[3][1] = -0.05036764705882353;
    local_8->A[3][2] = 0.027573529411764705;
    local_8->A[3][3] = 0.25;
    *local_8->A[4] = 1.0416666666666667;
    local_8->A[4][1] = -1.0208333333333333;
    local_8->A[4][2] = 7.8125;
    local_8->A[4][3] = -7.083333333333333;
    local_8->A[4][4] = 0.25;
    *local_8->b = 1.0416666666666667;
    local_8->b[1] = -1.0208333333333333;
    local_8->b[2] = 7.8125;
    local_8->b[3] = -7.083333333333333;
    local_8->b[4] = 0.25;
    *local_8->d = 1.2291666666666667;
    local_8->d[1] = -0.17708333333333334;
    local_8->d[2] = 7.03125;
    local_8->d[3] = -7.083333333333333;
    *local_8->c = 0.25;
    local_8->c[1] = (sunrealtype)&DAT_3fe8000000000000;
    local_8->c[2] = 0.55;
    local_8->c[3] = 0.5;
    local_8->c[4] = 1.0;
    break;
  case 0x6c:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    *local_8->A[1] = 0.435866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 0.1407377747247062;
    local_8->A[2][1] = -0.1083655513813208;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.102399400619911;
    local_8->A[3][1] = -0.3768784522555561;
    local_8->A[3][2] = 0.8386125301271861;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->A[4] = 0.15702489786032495;
    local_8->A[4][1] = 0.11733044137043885;
    local_8->A[4][2] = 0.6166780303921214;
    local_8->A[4][3] = -0.32689989113134427;
    local_8->A[4][4] = 0.435866521508459;
    *local_8->b = 0.15702489786032495;
    local_8->b[1] = 0.11733044137043885;
    local_8->b[2] = 0.6166780303921214;
    local_8->b[3] = -0.32689989113134427;
    local_8->b[4] = 0.435866521508459;
    *local_8->d = 0.102399400619911;
    local_8->d[1] = -0.3768784522555561;
    local_8->d[2] = 0.8386125301271861;
    local_8->d[3] = 0.435866521508459;
    local_8->c[1] = 0.871733043016918;
    local_8->c[2] = 0.4682387448518444;
    local_8->c[3] = 1.0;
    local_8->c[4] = 1.0;
    break;
  case 0x6d:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    *local_8->A[1] = 0.25;
    local_8->A[1][1] = 0.25;
    *local_8->A[2] = 0.137776;
    local_8->A[2][1] = -0.055776;
    local_8->A[2][2] = 0.25;
    *local_8->A[3] = 0.14463686602698217;
    local_8->A[3][1] = -0.22393190761334475;
    local_8->A[3][2] = 0.4492950415863626;
    local_8->A[3][3] = 0.25;
    *local_8->A[4] = 0.09825878328356477;
    local_8->A[4][1] = -0.5915442428196704;
    local_8->A[4][2] = 0.8101210538282996;
    local_8->A[4][3] = 0.283164405707806;
    local_8->A[4][4] = 0.25;
    *local_8->A[5] = 0.15791629516167136;
    local_8->A[5][2] = 0.18675894052400077;
    local_8->A[5][3] = 0.6805652953093346;
    local_8->A[5][4] = -0.27524053099500667;
    local_8->A[5][5] = 0.25;
    *local_8->b = 0.15791629516167136;
    local_8->b[2] = 0.18675894052400077;
    local_8->b[3] = 0.6805652953093346;
    local_8->b[4] = -0.27524053099500667;
    local_8->b[5] = 0.25;
    local_8->c[1] = 0.5;
    local_8->c[2] = 0.332;
    local_8->c[3] = 0.62;
    local_8->c[4] = 0.85;
    local_8->c[5] = 1.0;
    *local_8->d = 0.15471180076321217;
    local_8->d[2] = 0.18920519166068023;
    local_8->d[3] = 0.7020453712289219;
    local_8->d[4] = -0.3191873990635791;
    local_8->d[5] = 0.27322503541076487;
    break;
  case 0x6e:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 5;
    local_8->p = 4;
    *local_8->A[1] = 0.26;
    local_8->A[1][1] = 0.26;
    *local_8->A[2] = 0.13;
    local_8->A[2][1] = 0.8403332099679081;
    local_8->A[2][2] = 0.26;
    *local_8->A[3] = 0.22371961478320507;
    local_8->A[3][1] = 0.476755323197997;
    local_8->A[3][2] = -0.06470895363112615;
    local_8->A[3][3] = 0.26;
    *local_8->A[4] = 0.16648564323248322;
    local_8->A[4][1] = 0.1045001884159172;
    local_8->A[4][2] = 0.03631482272098715;
    local_8->A[4][3] = -0.13090704451073998;
    local_8->A[4][4] = 0.26;
    *local_8->A[5] = 0.13855640231268224;
    local_8->A[5][2] = -0.04245337201752043;
    local_8->A[5][3] = 0.02446657898003142;
    local_8->A[5][4] = 0.6194303907248068;
    local_8->A[5][5] = 0.26;
    *local_8->A[6] = 0.13659751177640292;
    local_8->A[6][2] = -0.054969087965383766;
    local_8->A[6][3] = -0.04118626728321047;
    local_8->A[6][4] = 0.629933048990164;
    local_8->A[6][5] = 0.06962479448202728;
    local_8->A[6][6] = 0.26;
    *local_8->b = 0.13659751177640292;
    local_8->b[2] = -0.054969087965383766;
    local_8->b[3] = -0.04118626728321047;
    local_8->b[4] = 0.629933048990164;
    local_8->b[5] = 0.06962479448202728;
    local_8->b[6] = 0.26;
    *local_8->d = 0.13855640231268224;
    local_8->d[2] = -0.04245337201752043;
    local_8->d[3] = 0.02446657898003142;
    local_8->d[4] = 0.6194303907248068;
    local_8->d[5] = 0.26;
    local_8->c[1] = 0.52;
    local_8->c[2] = 1.230333209967908;
    local_8->c[3] = 0.8957659843500759;
    local_8->c[4] = 0.43639360985864756;
    local_8->c[5] = 1.0;
    local_8->c[6] = 1.0;
    break;
  case 0x6f:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 5;
    local_8->p = 4;
    *local_8->A[1] = 0.205;
    local_8->A[1][1] = 0.205;
    *local_8->A[2] = 0.1025;
    local_8->A[2][1] = -0.047570415551619845;
    local_8->A[2][2] = 0.205;
    *local_8->A[3] = 0.07389944079200692;
    local_8->A[3][2] = -0.08074895409950329;
    local_8->A[3][3] = 0.205;
    *local_8->A[4] = 0.299218118308015;
    local_8->A[4][2] = 2.4638206661140414;
    local_8->A[4][3] = -2.0480387844220567;
    local_8->A[4][4] = 0.205;
    *local_8->A[5] = 0.14689238442881303;
    local_8->A[5][2] = 0.11740332879881549;
    local_8->A[5][3] = -0.221701968002454;
    local_8->A[5][4] = -0.007593745225174481;
    local_8->A[5][5] = 0.205;
    *local_8->A[6] = 0.17845729560319554;
    local_8->A[6][2] = 1.0197467452199207;
    local_8->A[6][3] = -0.22154535039396367;
    local_8->A[6][4] = -0.03612491620526532;
    local_8->A[6][5] = -0.5455337742238872;
    local_8->A[6][6] = 0.205;
    *local_8->A[7] = -0.09554858675139874;
    local_8->A[7][3] = 2.3386928037652464;
    local_8->A[7][4] = -0.14043175608247527;
    local_8->A[7][5] = -2.070587707956559;
    local_8->A[7][6] = 0.7628752470251866;
    local_8->A[7][7] = 0.205;
    *local_8->b = -0.09554858675139874;
    local_8->b[3] = 2.3386928037652464;
    local_8->b[4] = -0.14043175608247527;
    local_8->b[5] = -2.070587707956559;
    local_8->b[6] = 0.7628752470251866;
    local_8->b[7] = 0.205;
    *local_8->d = -0.09957696480500873;
    local_8->d[3] = 2.407162879999775;
    local_8->d[4] = -0.1601481830855136;
    local_8->d[5] = -2.1442365964445265;
    local_8->d[6] = 0.7795656224249983;
    local_8->d[7] = 0.21723324191027585;
    local_8->c[1] = 0.41;
    local_8->c[2] = 0.25992958444838016;
    local_8->c[3] = 0.19815048669250362;
    local_8->c[4] = 0.92;
    local_8->c[5] = 0.24;
    local_8->c[6] = 0.6;
    local_8->c[7] = 1.0;
    break;
  case 0x70:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    *local_8->A[1] = 0.1235;
    local_8->A[1][1] = 0.1235;
    *local_8->A[2] = 0.14907768747653863;
    local_8->A[2][1] = 0.14907768747653863;
    local_8->A[2][2] = 0.1235;
    *local_8->A[3] = 0.12483442871739439;
    local_8->A[3][1] = 0.12483442871739439;
    local_8->A[3][2] = -0.03816885743478878;
    local_8->A[3][3] = 0.1235;
    *local_8->A[4] = -0.07303194030218091;
    local_8->A[4][1] = -0.07303194030218091;
    local_8->A[4][2] = -0.2434356871601467;
    local_8->A[4][3] = 0.3409995677645085;
    local_8->A[4][4] = 0.1235;
    *local_8->A[5] = -0.15296500088128806;
    local_8->A[5][1] = -0.15296500088128806;
    local_8->A[5][2] = 0.07220562047433587;
    local_8->A[5][3] = 0.40430630248551713;
    local_8->A[5][4] = 0.4059180788027232;
    local_8->A[5][5] = 0.1235;
    local_8->A[6][2] = 0.5161107283174237;
    local_8->A[6][3] = -0.1460635639385708;
    local_8->A[6][4] = 0.23473048589019332;
    local_8->A[6][5] = 0.27172234973095377;
    local_8->A[6][6] = 0.1235;
    local_8->b[2] = 0.5161107283174237;
    local_8->b[3] = -0.1460635639385708;
    local_8->b[4] = 0.23473048589019332;
    local_8->b[5] = 0.27172234973095377;
    local_8->b[6] = 0.1235;
    local_8->c[1] = 0.247;
    local_8->c[2] = 0.42165537495307726;
    local_8->c[3] = 0.335;
    local_8->c[4] = 0.075;
    local_8->c[5] = 0.7;
    local_8->c[6] = 1.0;
    local_8->d[2] = 0.5175217461593482;
    local_8->d[3] = -0.15173820706113939;
    local_8->d[4] = 0.23672007870234135;
    local_8->d[5] = 0.2754463821994498;
    local_8->d[6] = 0.12205;
    break;
  case 0x71:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 5;
    local_8->p = 4;
    *local_8->A[1] = 0.2222222222222222;
    local_8->A[1][1] = 0.2222222222222222;
    *local_8->A[2] = 0.26824595137478835;
    local_8->A[2][1] = 0.26824595137478835;
    local_8->A[2][2] = 0.2222222222222222;
    *local_8->A[3] = -0.057945592237231995;
    local_8->A[3][1] = -0.057945592237231995;
    local_8->A[3][2] = 0.008938396816283733;
    local_8->A[3][3] = 0.2222222222222222;
    *local_8->A[4] = -0.043305287723547685;
    local_8->A[4][1] = -0.043305287723547685;
    local_8->A[4][2] = -0.034013891077568637;
    local_8->A[4][3] = 0.25515937270676026;
    local_8->A[4][4] = 0.2222222222222222;
    *local_8->A[5] = 0.13179599023759678;
    local_8->A[5][1] = 0.13179599023759678;
    local_8->A[5][2] = -0.03237672627786233;
    local_8->A[5][3] = 0.12385474427672251;
    local_8->A[5][4] = 0.14270777930372408;
    local_8->A[5][5] = 0.2222222222222222;
    *local_8->A[6] = 0.3093228210043426;
    local_8->A[6][1] = 0.3093228210043426;
    local_8->A[6][2] = -0.6829199272336792;
    local_8->A[6][3] = -0.05882275614969546;
    local_8->A[6][4] = -0.04130861383349944;
    local_8->A[6][5] = 0.8971834329859666;
    local_8->A[6][6] = 0.2222222222222222;
    local_8->A[7][2] = 0.1736625357358126;
    local_8->A[7][3] = 0.2547916626081235;
    local_8->A[7][4] = 0.2419017684509479;
    local_8->A[7][5] = 0.30740485830222825;
    local_8->A[7][6] = -0.19998304731933453;
    local_8->A[7][7] = 0.2222222222222222;
    local_8->b[2] = 0.1736625357358126;
    local_8->b[3] = 0.2547916626081235;
    local_8->b[4] = 0.2419017684509479;
    local_8->b[5] = 0.30740485830222825;
    local_8->b[6] = -0.19998304731933453;
    local_8->b[7] = 0.2222222222222222;
    local_8->d[2] = 0.06272421695270713;
    local_8->d[3] = 0.25523315714677963;
    local_8->d[4] = 0.23902754916001318;
    local_8->d[5] = 0.399079522075358;
    local_8->d[6] = -0.14315725125850667;
    local_8->d[7] = 0.18709280592364871;
    local_8->c[1] = 0.4444444444444444;
    local_8->c[2] = 0.7587141249717989;
    local_8->c[3] = 0.11526943456404197;
    local_8->c[4] = 0.3567571284043185;
    local_8->c[5] = 0.72;
    local_8->c[6] = 0.955;
    local_8->c[7] = 1.0;
    break;
  case 0x72:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 3;
    local_8->p = 2;
    *local_8->A[1] = 0.435866521508459;
    local_8->A[1][1] = 0.435866521508459;
    *local_8->A[2] = 0.2576482460664272;
    local_8->A[2][1] = -0.09351476757488625;
    local_8->A[2][2] = 0.435866521508459;
    *local_8->A[3] = 0.18764102434672383;
    local_8->A[3][1] = -0.595297473576955;
    local_8->A[3][2] = 0.9717899277217721;
    local_8->A[3][3] = 0.435866521508459;
    *local_8->b = 0.18764102434672383;
    local_8->b[1] = -0.595297473576955;
    local_8->b[2] = 0.9717899277217721;
    local_8->b[3] = 0.435866521508459;
    *local_8->d = 0.10889661761586446;
    local_8->d[1] = -0.9153258118707127;
    local_8->d[2] = 1.271273597302152;
    local_8->d[3] = 0.5351555969526961;
    local_8->c[1] = 0.871733043016918;
    local_8->c[2] = 0.6;
    local_8->c[3] = 1.0;
    break;
  case 0x73:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 3;
    local_8->p = 2;
    local_8->c[1] = 0.45;
    dVar1 = sqrt(2.0);
    local_8->c[2] = ((dVar1 + 2.0) * 9.0) / 40.0;
    local_8->c[3] = 0.6;
    local_8->c[4] = 1.0;
    dVar1 = sqrt(2.0);
    dVar2 = sqrt(2.0);
    *local_8->b = ((dVar1 * 1205.0 + 2398.0) / 2835.0) / (dVar2 * 3.0 + 4.0);
    dVar1 = sqrt(2.0);
    dVar2 = sqrt(2.0);
    local_8->b[1] = ((dVar1 * 1205.0 + 2398.0) / 2835.0) / (dVar2 * 3.0 + 4.0);
    dVar1 = sqrt(2.0);
    dVar1 = ((dVar1 + dVar1 + 1.0) * -2374.0) / 2835.0;
    dVar2 = sqrt(2.0);
    local_8->b[2] = dVar1 / (dVar2 * 3.0 + 5.0);
    local_8->b[3] = 0.7707671957671958;
    local_8->b[4] = 0.225;
    dVar1 = sqrt(2.0);
    *local_8->d = (dVar1 * 5547709.0 + -4800247.0) / 16519545.0;
    dVar1 = sqrt(2.0);
    local_8->d[1] = (dVar1 * 5547709.0 + -4800247.0) / 16519545.0;
    dVar1 = sqrt(2.0);
    local_8->d[2] = ((1.0 - dVar1) * 11095418.0) / 16519545.0;
    local_8->d[3] = 0.6968620125433237;
    local_8->d[4] = 0.21264372747554489;
    *local_8->A[1] = 0.225;
    local_8->A[1][1] = 0.225;
    dVar1 = sqrt(2.0);
    *local_8->A[2] = ((dVar1 + 1.0) * 9.0) / 80.0;
    dVar1 = sqrt(2.0);
    local_8->A[2][1] = ((dVar1 + 1.0) * 9.0) / 80.0;
    local_8->A[2][2] = 0.225;
    dVar1 = sqrt(2.0);
    dVar2 = sqrt(2.0);
    *local_8->A[3] = ((dVar1 * 15.0 + 22.0) / 80.0) / (dVar2 + 1.0);
    dVar1 = sqrt(2.0);
    dVar2 = sqrt(2.0);
    local_8->A[3][1] = ((dVar1 * 15.0 + 22.0) / 80.0) / (dVar2 + 1.0);
    dVar1 = sqrt(2.0);
    local_8->A[3][2] = -0.175 / (dVar1 + 1.0);
    local_8->A[3][3] = 0.225;
    *local_8->A[4] = *local_8->b;
    local_8->A[4][1] = local_8->b[1];
    local_8->A[4][2] = local_8->b[2];
    local_8->A[4][3] = local_8->b[3];
    local_8->A[4][4] = local_8->b[4];
    break;
  case 0x74:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 3;
    local_8->p = 2;
    local_8->c[1] = 0.45;
    local_8->c[2] = 0.8;
    local_8->c[3] = 1.0;
    local_8->c[4] = 1.0;
    *local_8->b = 0.21322176213480562;
    local_8->b[1] = 0.3260047980544875;
    local_8->b[2] = 0.5373779946761313;
    local_8->b[3] = -0.3016045548654244;
    local_8->b[4] = 0.225;
    *local_8->d = 0.2272160877233341;
    local_8->d[1] = 0.3255666195624788;
    local_8->d[2] = 0.46861135758651284;
    local_8->d[3] = -0.20520648979080866;
    local_8->d[4] = 0.18381242491848293;
    *local_8->A[1] = 0.225;
    local_8->A[1][1] = 0.225;
    *local_8->A[2] = 0.2638888888888889;
    local_8->A[2][1] = 0.3111111111111111;
    local_8->A[2][2] = 0.225;
    *local_8->A[3] = 0.2896701388888889;
    local_8->A[3][1] = 0.3236111111111111;
    local_8->A[3][2] = 0.16171875;
    local_8->A[3][3] = 0.225;
    *local_8->A[4] = *local_8->b;
    local_8->A[4][1] = local_8->b[1];
    local_8->A[4][2] = local_8->b[2];
    local_8->A[4][3] = local_8->b[3];
    local_8->A[4][4] = local_8->b[4];
    break;
  case 0x75:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    local_8->c[1] = 0.5;
    dVar1 = sqrt(2.0);
    local_8->c[2] = (2.0 - dVar1) / 4.0;
    local_8->c[3] = 0.625;
    local_8->c[4] = 1.04;
    local_8->c[5] = 1.0;
    dVar1 = sqrt(2.0);
    *local_8->b = (dVar1 * -987.0 + 1181.0) / 13782.0;
    dVar1 = sqrt(2.0);
    local_8->b[1] = (dVar1 * -987.0 + 1181.0) / 13782.0;
    dVar1 = sqrt(2.0);
    local_8->b[2] = ((dVar1 * 1783.0 + -267.0) * 47.0) / 273343.0;
    dVar1 = sqrt(2.0);
    local_8->b[3] = ((dVar1 * 3525.0 + -22922.0) * -16.0) / 571953.0;
    dVar1 = sqrt(2.0);
    local_8->b[4] = ((dVar1 * 376.0 + 97.0) * -15625.0) / 90749876.0;
    local_8->b[5] = 0.25;
    *local_8->d = -0.09651334216818033;
    local_8->d[1] = -0.09651334216818033;
    local_8->d[2] = 0.5228199509962342;
    local_8->d[3] = 0.5205678646221885;
    local_8->d[4] = -0.08255805440762122;
    local_8->d[5] = 0.23219692312555915;
    local_8->A[1][1] = 0.25;
    dVar1 = sqrt(2.0);
    local_8->A[2][1] = (1.0 - dVar1) / 8.0;
    local_8->A[2][2] = 0.25;
    dVar1 = sqrt(2.0);
    local_8->A[3][1] = (dVar1 * -7.0 + 5.0) / 64.0;
    dVar1 = sqrt(2.0);
    local_8->A[3][2] = ((dVar1 + 1.0) * 7.0) / 32.0;
    local_8->A[3][3] = 0.25;
    dVar1 = sqrt(2.0);
    local_8->A[4][1] = -(dVar1 * 54539.0 + 13796.0) / 125000.0;
    dVar1 = sqrt(2.0);
    local_8->A[4][2] = (dVar1 * 132109.0 + 506605.0) / 437500.0;
    dVar1 = sqrt(2.0);
    local_8->A[4][3] = ((dVar1 * 376.0 + -97.0) * 166.0) / 109375.0;
    local_8->A[4][4] = 0.25;
    *local_8->A[5] = *local_8->b;
    local_8->A[5][1] = local_8->b[1];
    local_8->A[5][2] = local_8->b[2];
    local_8->A[5][3] = local_8->b[3];
    local_8->A[5][4] = local_8->b[4];
    local_8->A[5][5] = local_8->b[5];
    *local_8->A[1] = local_8->c[1] - local_8->A[1][1];
    *local_8->A[2] = (local_8->c[2] - local_8->A[2][1]) - local_8->A[2][2];
    *local_8->A[3] = ((local_8->c[3] - local_8->A[3][1]) - local_8->A[3][2]) - local_8->A[3][3];
    *local_8->A[4] =
         (((local_8->c[4] - local_8->A[4][1]) - local_8->A[4][2]) - local_8->A[4][3]) -
         local_8->A[4][4];
    break;
  case 0x76:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    local_8->c[1] = 0.5;
    dVar1 = sqrt(2.0);
    local_8->c[2] = (2.0 - dVar1) / 4.0;
    local_8->c[3] = 0.5803591573139935;
    local_8->c[4] = 1.0;
    local_8->c[5] = 1.0;
    *local_8->b = 0.06632461208191097;
    local_8->b[1] = 0.06632461208191097;
    local_8->b[2] = 0.22236269423069369;
    local_8->b[3] = 0.5021309387483415;
    local_8->b[4] = -0.10714285714285714;
    local_8->b[5] = 0.25;
    *local_8->d = -0.018437906120613;
    local_8->d[1] = -0.018437906120613;
    local_8->d[2] = 0.3643795346432077;
    local_8->d[3] = 0.5162497304522604;
    local_8->d[4] = -0.06251150951414057;
    local_8->d[5] = 0.2187580566598984;
    local_8->A[1][1] = 0.25;
    local_8->A[2][1] = -0.05177669529663688;
    local_8->A[2][2] = 0.25;
    local_8->A[3][1] = -0.12100710522809056;
    local_8->A[3][2] = 0.5723733677701747;
    local_8->A[3][3] = 0.25;
    local_8->A[4][1] = -0.6119504017336055;
    local_8->A[4][2] = 1.3587904035004925;
    local_8->A[4][3] = 0.6151103999667183;
    local_8->A[4][4] = 0.25;
    *local_8->A[5] = *local_8->b;
    local_8->A[5][1] = local_8->b[1];
    local_8->A[5][2] = local_8->b[2];
    local_8->A[5][3] = local_8->b[3];
    local_8->A[5][4] = local_8->b[4];
    local_8->A[5][5] = local_8->b[5];
    *local_8->A[1] = local_8->c[1] - local_8->A[1][1];
    *local_8->A[2] = (local_8->c[2] - local_8->A[2][1]) - local_8->A[2][2];
    *local_8->A[3] = ((local_8->c[3] - local_8->A[3][1]) - local_8->A[3][2]) - local_8->A[3][3];
    *local_8->A[4] =
         (((local_8->c[4] - local_8->A[4][1]) - local_8->A[4][2]) - local_8->A[4][3]) -
         local_8->A[4][4];
    break;
  case 0x77:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    local_8->c[1] = 0.21333333333333335;
    dVar1 = sqrt(2.0);
    local_8->c[2] = ((2.0 - dVar1) * 8.0) / 25.0;
    local_8->c[3] = 0.5237349638615413;
    local_8->c[4] = 1.0437682988410166;
    local_8->c[5] = 1.0;
    *local_8->b = 0.11507824627133408;
    local_8->b[2] = 0.13891173144118288;
    local_8->b[3] = 0.5589929940192544;
    local_8->b[4] = -0.1329829717317714;
    local_8->b[5] = 0.32;
    *local_8->d = -0.04435710074704296;
    local_8->d[1] = -1.5839347397183428;
    local_8->d[2] = 1.8584346081654304;
    local_8->d[3] = 0.5780406793432736;
    local_8->d[4] = -0.11463186751229457;
    local_8->d[5] = 0.3064484204689764;
    *local_8->A[1] = 0.10666666666666667;
    local_8->A[1][1] = 0.10666666666666667;
    *local_8->A[2] = 0.06627416997969521;
    local_8->A[2][1] = -0.19882250993908562;
    local_8->A[2][2] = 0.32;
    *local_8->A[3] = -0.4886087369119395;
    local_8->A[3][1] = -6.190751520067358;
    local_8->A[3][2] = 6.883095220840839;
    local_8->A[3][3] = 0.32;
    *local_8->A[4] = -3.1283269307169475;
    local_8->A[4][1] = -32.206585572984054;
    local_8->A[4][2] = 35.100563192176956;
    local_8->A[4][3] = 0.9581176103650633;
    local_8->A[4][4] = 0.32;
    *local_8->A[5] = *local_8->b;
    local_8->A[5][1] = local_8->b[1];
    local_8->A[5][2] = local_8->b[2];
    local_8->A[5][3] = local_8->b[3];
    local_8->A[5][4] = local_8->b[4];
    local_8->A[5][5] = local_8->b[5];
    break;
  case 0x78:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 4;
    local_8->p = 3;
    local_8->c[1] = 0.25;
    local_8->c[2] = 0.07322330470336312;
    local_8->c[3] = 0.5;
    local_8->c[4] = 0.6966490299823633;
    local_8->c[5] = 0.7063492063492064;
    local_8->c[6] = 1.0;
    local_8->b[1] = -0.40085161500960825;
    local_8->b[2] = 0.9391524145239087;
    local_8->b[3] = 0.5185422838949312;
    local_8->b[4] = 0.7755100321672022;
    local_8->b[5] = -0.5565015005668256;
    local_8->b[6] = 0.125;
    *local_8->b = (((((1.0 - local_8->b[1]) - local_8->b[2]) - local_8->b[3]) - local_8->b[4]) -
                  local_8->b[5]) - local_8->b[6];
    local_8->d[1] = -0.24210689376668584;
    local_8->d[2] = 0.6587096818817366;
    local_8->d[3] = 0.500477735724069;
    local_8->d[4] = 0.7607872310157867;
    local_8->d[5] = -0.5714751468025063;
    local_8->d[6] = 0.1357142857142857;
    *local_8->d = (((((1.0 - local_8->d[1]) - local_8->d[2]) - local_8->d[3]) - local_8->d[4]) -
                  local_8->d[5]) - local_8->d[6];
    local_8->A[1][1] = 0.125;
    local_8->A[2][1] = -0.02588834764831844;
    local_8->A[2][2] = 0.125;
    local_8->A[3][1] = 0.33838834764831843;
    local_8->A[3][2] = -0.30177669529663687;
    local_8->A[3][3] = 0.125;
    local_8->A[4][1] = -0.3592453618381594;
    local_8->A[4][2] = 0.9365078600463644;
    local_8->A[4][3] = 0.3536318936123176;
    local_8->A[4][4] = 0.125;
    local_8->A[5][1] = 0.23361061091244562;
    local_8->A[5][2] = -0.0433153738101898;
    local_8->A[5][3] = 0.01903274535895701;
    local_8->A[5][4] = 0.13841061297554788;
    local_8->A[5][5] = 0.125;
    *local_8->A[6] = *local_8->b;
    local_8->A[6][1] = local_8->b[1];
    local_8->A[6][2] = local_8->b[2];
    local_8->A[6][3] = local_8->b[3];
    local_8->A[6][4] = local_8->b[4];
    local_8->A[6][5] = local_8->b[5];
    local_8->A[6][6] = local_8->b[6];
    *local_8->A[1] = local_8->c[1] - local_8->A[1][1];
    *local_8->A[2] = (local_8->c[2] - local_8->A[2][1]) - local_8->A[2][2];
    *local_8->A[3] = ((local_8->c[3] - local_8->A[3][1]) - local_8->A[3][2]) - local_8->A[3][3];
    *local_8->A[4] =
         (((local_8->c[4] - local_8->A[4][1]) - local_8->A[4][2]) - local_8->A[4][3]) -
         local_8->A[4][4];
    *local_8->A[5] =
         ((((local_8->c[5] - local_8->A[5][1]) - local_8->A[5][2]) - local_8->A[5][3]) -
         local_8->A[5][4]) - local_8->A[5][5];
    break;
  case 0x79:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 5;
    local_8->p = 4;
    local_8->c[1] = 0.368;
    local_8->c[2] = 0.10778470452335051;
    local_8->c[3] = 0.52;
    local_8->c[4] = 0.6531582768582439;
    local_8->c[5] = 1.04;
    local_8->c[6] = 1.0;
    local_8->b[1] = -0.07599811454386138;
    local_8->b[2] = 0.42427748359919076;
    local_8->b[3] = 0.27546898147535387;
    local_8->b[4] = 0.3205107788979717;
    local_8->b[5] = -0.05226101488479355;
    local_8->b[6] = 0.184;
    *local_8->b = (((((1.0 - local_8->b[1]) - local_8->b[2]) - local_8->b[3]) - local_8->b[4]) -
                  local_8->b[5]) - local_8->b[6];
    local_8->d[1] = -0.10804934545430295;
    local_8->d[2] = 0.4837275788865379;
    local_8->d[3] = 0.23595105756244605;
    local_8->d[4] = 0.3753833643342551;
    local_8->d[5] = -0.03230666251372478;
    local_8->d[6] = 0.15334335263909166;
    *local_8->d = (((((1.0 - local_8->d[1]) - local_8->d[2]) - local_8->d[3]) - local_8->d[4]) -
                  local_8->d[5]) - local_8->d[6];
    local_8->A[1][1] = 0.184;
    local_8->A[2][1] = -0.03810764773832474;
    local_8->A[2][2] = 0.184;
    local_8->A[3][1] = 0.0216776649587785;
    local_8->A[3][2] = 0.292644670082443;
    local_8->A[3][3] = 0.184;
    local_8->A[4][1] = -0.8510462661735156;
    local_8->A[4][2] = 1.753303815732698;
    local_8->A[4][3] = 0.41794699347257747;
    local_8->A[4][4] = 0.184;
    local_8->A[5][1] = -5.03561612174922;
    local_8->A[5][2] = 8.971305293795128;
    local_8->A[5][3] = 0.31505839963851934;
    local_8->A[5][4] = 1.6408685500647917;
    local_8->A[5][5] = 0.184;
    *local_8->A[6] = *local_8->b;
    local_8->A[6][1] = local_8->b[1];
    local_8->A[6][2] = local_8->b[2];
    local_8->A[6][3] = local_8->b[3];
    local_8->A[6][4] = local_8->b[4];
    local_8->A[6][5] = local_8->b[5];
    local_8->A[6][6] = local_8->b[6];
    *local_8->A[1] = local_8->c[1] - local_8->A[1][1];
    *local_8->A[2] = (local_8->c[2] - local_8->A[2][1]) - local_8->A[2][2];
    *local_8->A[3] = ((local_8->c[3] - local_8->A[3][1]) - local_8->A[3][2]) - local_8->A[3][3];
    *local_8->A[4] =
         (((local_8->c[4] - local_8->A[4][1]) - local_8->A[4][2]) - local_8->A[4][3]) -
         local_8->A[4][4];
    *local_8->A[5] =
         ((((local_8->c[5] - local_8->A[5][1]) - local_8->A[5][2]) - local_8->A[5][3]) -
         local_8->A[5][4]) - local_8->A[5][5];
    break;
  case 0x7a:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 5;
    local_8->p = 4;
    local_8->c[1] = 0.368;
    local_8->c[2] = 0.6282152954766494;
    local_8->c[3] = 0.1388101983002833;
    local_8->c[4] = 0.6999586194045747;
    local_8->c[5] = 0.9083769633507853;
    local_8->c[6] = 1.0;
    local_8->b[1] = -0.03946606910974026;
    local_8->b[2] = 0.27263649025024267;
    local_8->b[3] = 0.4321651725202882;
    local_8->b[4] = 0.3524160862328891;
    local_8->b[5] = -0.16228561078393952;
    local_8->b[6] = 0.184;
    *local_8->b = (((((1.0 - local_8->b[1]) - local_8->b[2]) - local_8->b[3]) - local_8->b[4]) -
                  local_8->b[5]) - local_8->b[6];
    local_8->d[1] = -0.08068946656664744;
    local_8->d[2] = 0.18289968461343553;
    local_8->d[3] = 0.517013873766231;
    local_8->d[4] = 0.4265997313024543;
    local_8->d[5] = -0.10432685796713498;
    local_8->d[6] = 0.13919250141830897;
    *local_8->d = (((((1.0 - local_8->d[1]) - local_8->d[2]) - local_8->d[3]) - local_8->d[4]) -
                  local_8->d[5]) - local_8->d[6];
    local_8->A[1][1] = 0.184;
    local_8->A[2][1] = 0.22210764773832475;
    local_8->A[2][2] = 0.184;
    local_8->A[3][1] = -0.014049475381926283;
    local_8->A[3][2] = -0.01709085093586415;
    local_8->A[3][3] = 0.184;
    local_8->A[4][1] = -0.40838859254931464;
    local_8->A[4][2] = 0.16646399821362964;
    local_8->A[4][3] = 1.1662718062895745;
    local_8->A[4][4] = 0.184;
    local_8->A[5][1] = -0.5392907235588114;
    local_8->A[5][2] = -0.242234428845425;
    local_8->A[5][3] = 1.4888806111225146;
    local_8->A[5][4] = 0.5563122281913184;
    local_8->A[5][5] = 0.184;
    *local_8->A[6] = *local_8->b;
    local_8->A[6][1] = local_8->b[1];
    local_8->A[6][2] = local_8->b[2];
    local_8->A[6][3] = local_8->b[3];
    local_8->A[6][4] = local_8->b[4];
    local_8->A[6][5] = local_8->b[5];
    local_8->A[6][6] = local_8->b[6];
    *local_8->A[1] = local_8->c[1] - local_8->A[1][1];
    *local_8->A[2] = (local_8->c[2] - local_8->A[2][1]) - local_8->A[2][2];
    *local_8->A[3] = ((local_8->c[3] - local_8->A[3][1]) - local_8->A[3][2]) - local_8->A[3][3];
    *local_8->A[4] =
         (((local_8->c[4] - local_8->A[4][1]) - local_8->A[4][2]) - local_8->A[4][3]) -
         local_8->A[4][4];
    *local_8->A[5] =
         ((((local_8->c[5] - local_8->A[5][1]) - local_8->A[5][2]) - local_8->A[5][3]) -
         local_8->A[5][4]) - local_8->A[5][5];
    break;
  case 0x7b:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    dVar1 = sqrt(2.0);
    dVar1 = 1.0 - 1.0 / dVar1;
    dVar2 = sqrt(2.0);
    dVar2 = 1.0 / (dVar2 * 2.0);
    dVar3 = sqrt(2.0);
    dVar3 = 2.0 - dVar3;
    dVar4 = sqrt(2.0);
    dVar4 = (4.0 - dVar4) / 8.0;
    local_8->q = 2;
    local_8->p = 1;
    *local_8->A[1] = dVar1;
    local_8->A[1][1] = dVar1;
    *local_8->A[2] = dVar2;
    local_8->A[2][1] = dVar2;
    local_8->A[2][2] = dVar1;
    *local_8->b = dVar2;
    local_8->b[1] = dVar2;
    local_8->b[2] = dVar1;
    *local_8->d = dVar4;
    local_8->d[1] = dVar4;
    dVar1 = sqrt(2.0);
    local_8->d[2] = 1.0 / (dVar1 * 2.0);
    local_8->c[1] = dVar3;
    local_8->c[2] = 1.0;
    break;
  case 0x7c:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 1;
    local_8->p = 0;
    **local_8->A = 1.0;
    *local_8->b = 1.0;
    *local_8->c = 1.0;
    break;
  case 0x7d:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 2;
    local_8->p = 0;
    **local_8->A = 0.5;
    *local_8->b = 1.0;
    *local_8->c = 0.5;
    break;
  case 0x7e:
    local_8 = ARKodeButcherTable_Alloc(stages,embedded);
    local_8->q = 2;
    local_8->p = 0;
    *local_8->A[1] = 0.5;
    local_8->A[1][1] = 0.5;
    *local_8->b = 0.5;
    local_8->b[1] = 0.5;
    local_8->c[1] = 1.0;
    break;
  case 0xffffffff:
    local_8 = (ARKodeButcherTable)0x0;
  }
  return local_8;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)
{
  /* Use X-macro to test each method name */
  switch (imethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: coeff break;
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}